

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_NtkCheckRecursive(Au_Ntk_t *pNtk)

{
  Au_Man_t *pAVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  pAVar1 = pNtk->pMan;
  if (pAVar1 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    iVar5 = 0;
  }
  else {
    iVar6 = (pAVar1->vNtks).nSize;
    iVar5 = 0;
    if (1 < iVar6) {
      lVar11 = 1;
      iVar5 = 0;
      do {
        puVar2 = (undefined8 *)(pAVar1->vNtks).pArray[lVar11];
        lVar8 = (long)*(int *)((long)puVar2 + 0x3c);
        if (0 < lVar8) {
          lVar9 = 0;
          do {
            if (lVar8 == lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar7 = *(uint *)(puVar2[8] + lVar9 * 4);
            lVar3 = *(long *)(puVar2[0xf] + (long)((int)uVar7 >> 0xc) * 8);
            uVar10 = (ulong)((uVar7 & 0xfff) << 4);
            uVar4 = *(ulong *)(lVar3 + uVar10);
            if ((uVar4 & 0x700000000) == 0x600000000) {
              lVar3 = *(long *)(*(long *)(lVar3 + uVar10 & 0xfffffffffffffc00) + 8);
              uVar7 = (uint)uVar4;
              if (*(int *)(lVar3 + 0xc) <= (int)(uVar7 & 0x3fffffff)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              if (*(undefined8 **)(*(long *)(lVar3 + 0x10) + (ulong)(uVar7 & 0x3fffffff) * 8) ==
                  puVar2) {
                printf("WARNING: Model \"%s\" contains a recursive definition.\n",*puVar2);
                iVar6 = (pAVar1->vNtks).nSize;
                iVar5 = 1;
                break;
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar6);
    }
  }
  return iVar5;
}

Assistant:

int Au_NtkCheckRecursive( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel;
    Au_Obj_t * pObj;
    int i, k, RetValue = 0;

    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return RetValue;
    }

    vMods = &pNtk->pMan->vNtks;
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        Au_NtkForEachObj( pModel, pObj, k )
            if ( Au_ObjIsBox(pObj) && Au_ObjModel(pObj) == pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Au_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}